

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void outlet_pointer(_outlet *x,t_gpointer *gp)

{
  anon_union_8_2_4cf7151e_for_gp_un local_38;
  t_gpointer gpointer;
  _outconnect *oc;
  t_gpointer *gp_local;
  _outlet *x_local;
  
  stackcount = stackcount + 1;
  if (stackcount < 1000) {
    local_38 = gp->gp_un;
    gpointer.gp_un = *(anon_union_8_2_4cf7151e_for_gp_un *)&gp->gp_valid;
    gpointer._8_8_ = gp->gp_stub;
    for (gpointer.gp_stub = (t_gstub *)x->o_connections; gpointer.gp_stub != (t_gstub *)0x0;
        gpointer.gp_stub = (t_gstub *)((gpointer.gp_stub)->gs_un).gs_glist) {
      pd_pointer(*(t_pd **)&(gpointer.gp_stub)->gs_which,(t_gpointer *)&local_38);
    }
  }
  else {
    outlet_stackerror(x);
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_pointer(t_outlet *x, t_gpointer *gp)
{
    t_outconnect *oc;
    t_gpointer gpointer;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    {
        gpointer = *gp;
        for (oc = x->o_connections; oc; oc = oc->oc_next)
            pd_pointer(oc->oc_to, &gpointer);
    }
    --stackcount;
}